

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoteRestrictionManager.h
# Opt level: O3

void __thiscall
jaegertracing::baggage::RemoteRestrictionManager::~RemoteRestrictionManager
          (RemoteRestrictionManager *this)

{
  *(undefined **)this = &YAML::BadSubscript::typeinfo;
  (*__M_assign)();
  std::condition_variable::~condition_variable((condition_variable *)(this + 0x118));
  if (*(long *)(this + 0x110) != 0) {
    std::terminate();
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jaegertracing::baggage::Restriction>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jaegertracing::baggage::Restriction>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jaegertracing::baggage::Restriction>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jaegertracing::baggage::Restriction>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(this + 0xd0));
  if (*(RemoteRestrictionManager **)(this + 8) != this + 0x18) {
    operator_delete(*(RemoteRestrictionManager **)(this + 8));
    return;
  }
  return;
}

Assistant:

~RemoteRestrictionManager() { close(); }